

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

char * LLVMGetErrorMessage(LLVMErrorRef Err)

{
  char *__dest;
  Error *in_RDX;
  undefined1 local_48 [8];
  string Tmp;
  
  Tmp.field_2._8_8_ = (ulong)Err | 1;
  llvm::toString_abi_cxx11_((string *)local_48,(llvm *)(Tmp.field_2._M_local_buf + 8),in_RDX);
  if ((long *)(Tmp.field_2._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(Tmp.field_2._8_8_ & 0xfffffffffffffffe) + 8))();
  }
  __dest = (char *)operator_new__((ulong)(Tmp._M_dataplus._M_p + 1));
  memcpy(__dest,(void *)local_48,(size_t)Tmp._M_dataplus._M_p);
  __dest[(long)Tmp._M_dataplus._M_p] = '\0';
  std::__cxx11::string::~string((string *)local_48);
  return __dest;
}

Assistant:

char *LLVMGetErrorMessage(LLVMErrorRef Err) {
  std::string Tmp = toString(unwrap(Err));
  char *ErrMsg = new char[Tmp.size() + 1];
  memcpy(ErrMsg, Tmp.data(), Tmp.size());
  ErrMsg[Tmp.size()] = '\0';
  return ErrMsg;
}